

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCompositeInertia.cpp
# Opt level: O1

ChMatrix33<double> * chrono::utils::CompositeInertia::InertiaShiftMatrix(ChVector<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChMatrix33<double> *shift;
  ChMatrix33<double> *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  
  dVar1 = v->m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  dVar2 = v->m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar2 * dVar2;
  auVar4 = vfmadd213sd_fma(auVar4,auVar4,auVar5);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar4._0_8_;
  dVar7 = v->m_data[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar7;
  auVar4 = vfmadd231sd_fma(auVar5,auVar8,auVar8);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar4._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1 * dVar1;
  auVar4 = vfmadd231sd_fma(auVar6,auVar8,auVar8);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar4._0_8_;
  dVar7 = -dVar7;
  dVar3 = dVar1 * dVar7;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar3;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar3;
  dVar7 = dVar2 * dVar7;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar7;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar7;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar2 * -dVar1;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar2 * -dVar1;
  return in_RDI;
}

Assistant:

ChMatrix33<> CompositeInertia::InertiaShiftMatrix(const ChVector<>& v) {
    ChMatrix33<> shift;
    shift(0, 0) = v.y() * v.y() + v.z() * v.z();
    shift(1, 1) = v.x() * v.x() + v.z() * v.z();
    shift(2, 2) = v.x() * v.x() + v.y() * v.y();
    shift(0, 1) = -v.x() * v.y();
    shift(1, 0) = -v.x() * v.y();
    shift(0, 2) = -v.x() * v.z();
    shift(2, 0) = -v.x() * v.z();
    shift(1, 2) = -v.y() * v.z();
    shift(2, 1) = -v.y() * v.z();

    return shift;
}